

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_nanoftp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int n_URL_1;
  int n_ctx;
  uint uVar15;
  uint uVar16;
  ulong in_RSI;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  int n_directory;
  uint uVar21;
  undefined8 *puVar22;
  int test_ret_4;
  int test_ret_3;
  uint uVar23;
  ulong *puVar24;
  undefined4 *puVar25;
  int test_ret_1;
  int test_ret;
  int test_ret_2;
  int local_48;
  int local_44;
  ulong local_40;
  
  if (quiet == '\0') {
    puts("Testing nanoftp : 14 of 22 functions ...");
  }
  uVar15 = 0;
  local_44 = 0;
  do {
    iVar1 = xmlMemBlocks();
    pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,(int)in_RSI);
    xmlNanoFTPCheckResponse(pvVar12);
    call_tests = call_tests + 1;
    if (pvVar12 != (void *)0x0) {
      xmlNanoFTPFreeCtxt(pvVar12);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCheckResponse",(ulong)(uint)(iVar2 - iVar1));
      local_44 = local_44 + 1;
      in_RSI = (ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlNanoFTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in xmlNanoFTPCleanup");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar15 = 0;
  local_48 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,(int)in_RSI);
    xmlNanoFTPCloseConnection(pvVar12);
    call_tests = call_tests + 1;
    if (pvVar12 != (void *)0x0) {
      xmlNanoFTPFreeCtxt(pvVar12);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCloseConnection",(ulong)(uint)(iVar4 - iVar3));
      local_48 = local_48 + 1;
      in_RSI = (ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar15 = 0;
  do {
    puVar24 = &DAT_00165d58;
    uVar17 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,iVar5);
      uVar21 = (uint)uVar17;
      if (uVar21 < 3) {
        in_RSI = *puVar24;
      }
      else {
        in_RSI = 0;
      }
      xmlNanoFTPCwd(pvVar12);
      call_tests = call_tests + 1;
      if (pvVar12 != (void *)0x0) {
        xmlNanoFTPFreeCtxt(pvVar12);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPCwd",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = uVar17;
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)uVar21;
      puVar24 = puVar24 + 1;
    } while (uVar21 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar15 = 0;
  do {
    puVar24 = &DAT_00165d90;
    uVar17 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,iVar6);
      uVar21 = (uint)uVar17;
      if (uVar21 < 7) {
        in_RSI = *puVar24;
      }
      else {
        in_RSI = 0;
      }
      xmlNanoFTPDele(pvVar12);
      call_tests = call_tests + 1;
      if (pvVar12 != (void *)0x0) {
        xmlNanoFTPFreeCtxt(pvVar12);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPDele",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = uVar17;
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)uVar21;
      puVar24 = puVar24 + 1;
    } while (uVar21 != 8);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  iVar1 = (uint)(iVar1 != iVar2) + local_44 + local_48;
  function_tests = function_tests + 1;
  uVar15 = 0;
  iVar2 = 0;
  do {
    iVar5 = xmlMemBlocks();
    pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,(int)in_RSI);
    xmlNanoFTPGetResponse(pvVar12);
    call_tests = call_tests + 1;
    if (pvVar12 != (void *)0x0) {
      xmlNanoFTPFreeCtxt(pvVar12);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPGetResponse",(ulong)(uint)(iVar6 - iVar5));
      iVar2 = iVar2 + 1;
      in_RSI = (ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlNanoFTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoFTPInit",(ulong)(uint)(iVar7 - iVar5));
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar22 = &DAT_00165d90;
  uVar15 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar15 < 7) {
      uVar19 = *puVar22;
    }
    else {
      uVar19 = 0;
    }
    xmlNanoFTPNewCtxt(uVar19);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPNewCtxt",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar15 != 8);
  function_tests = function_tests + 1;
  puVar22 = &DAT_00165d90;
  uVar15 = 0;
  local_48 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar15 < 7) {
      uVar19 = *puVar22;
    }
    else {
      uVar19 = 0;
    }
    xmlNanoFTPOpen(uVar19);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPOpen",(ulong)(uint)(iVar9 - iVar8));
      local_48 = local_48 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar15 != 8);
  function_tests = function_tests + 1;
  uVar15 = 0;
  do {
    uVar21 = 0;
    do {
      uVar16 = 0;
      do {
        uVar17 = 0;
        do {
          uVar23 = 0;
          puVar25 = &DAT_00163454;
          do {
            if (uVar15 < 3) {
              uVar19 = (&DAT_00165d58)[uVar15];
            }
            else {
              uVar19 = 0;
            }
            uVar18 = 0xffffffff;
            if (uVar21 < 4) {
              uVar18 = (ulong)(uint)(&DAT_00163454)[uVar21];
            }
            if (uVar16 < 3) {
              uVar14 = (&DAT_00165d58)[uVar16];
            }
            else {
              uVar14 = 0;
            }
            if ((uint)uVar17 < 3) {
              uVar13 = (&DAT_00165d58)[uVar17];
            }
            else {
              uVar13 = 0;
            }
            uVar20 = 0xffffffff;
            if (uVar23 < 4) {
              uVar20 = *puVar25;
            }
            xmlNanoFTPProxy(uVar19,uVar18,uVar14,uVar13,uVar20);
            call_tests = call_tests + 1;
            xmlResetLastError();
            uVar23 = uVar23 + 1;
            puVar25 = puVar25 + 1;
          } while (uVar23 != 4);
          uVar23 = (uint)uVar17 + 1;
          uVar17 = (ulong)uVar23;
        } while (uVar23 != 4);
        uVar16 = uVar16 + 1;
      } while (uVar16 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  uVar15 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,(int)uVar18);
    xmlNanoFTPQuit(pvVar12);
    call_tests = call_tests + 1;
    if (pvVar12 != (void *)0x0) {
      xmlNanoFTPFreeCtxt(pvVar12);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPQuit",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      uVar18 = (ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar15 = 0;
  do {
    local_40 = 0;
    do {
      uVar21 = 0;
      puVar25 = &DAT_00163454;
      do {
        iVar10 = (int)uVar18;
        iVar9 = xmlMemBlocks();
        pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,iVar10);
        uVar20 = 0xffffffff;
        if (uVar21 < 4) {
          uVar20 = *puVar25;
        }
        uVar18 = 0;
        xmlNanoFTPRead(pvVar12,0,uVar20);
        call_tests = call_tests + 1;
        if (pvVar12 != (void *)0x0) {
          xmlNanoFTPFreeCtxt(pvVar12);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNanoFTPRead",(ulong)(uint)(iVar10 - iVar9));
          local_44 = local_44 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",local_40);
          uVar18 = (ulong)uVar21;
          printf(" %d");
          putchar(10);
        }
        uVar21 = uVar21 + 1;
        puVar25 = puVar25 + 1;
      } while (uVar21 != 4);
      iVar9 = (int)local_40;
      local_40 = (ulong)(iVar9 + 1);
    } while (iVar9 == 0);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  uVar15 = 0;
  puVar22 = &DAT_00165d90;
  do {
    if (uVar15 < 7) {
      uVar19 = *puVar22;
    }
    else {
      uVar19 = 0;
    }
    xmlNanoFTPScanProxy(uVar19);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar15 = uVar15 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar15 != 8);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar15 = 0;
  do {
    puVar24 = &DAT_00165d90;
    uVar17 = 0;
    do {
      iVar11 = (int)uVar18;
      iVar10 = xmlMemBlocks();
      pvVar12 = gen_xmlNanoFTPCtxtPtr(uVar15,iVar11);
      uVar21 = (uint)uVar17;
      if (uVar21 < 7) {
        uVar18 = *puVar24;
      }
      else {
        uVar18 = 0;
      }
      xmlNanoFTPUpdateURL(pvVar12);
      call_tests = call_tests + 1;
      if (pvVar12 != (void *)0x0) {
        xmlNanoFTPFreeCtxt(pvVar12);
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPUpdateURL",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        uVar18 = uVar17;
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)uVar21;
      puVar24 = puVar24 + 1;
    } while (uVar21 != 8);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  uVar15 = iVar1 + iVar3 + iVar4 + iVar2 + (uint)(iVar5 != iVar6) + iVar7 + local_48 + iVar8 +
           local_44 + iVar9;
  if (uVar15 != 0) {
    printf("Module nanoftp: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_nanoftp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanoftp : 14 of 22 functions ...\n");
    test_ret += test_xmlNanoFTPCheckResponse();
    test_ret += test_xmlNanoFTPCleanup();
    test_ret += test_xmlNanoFTPCloseConnection();
    test_ret += test_xmlNanoFTPCwd();
    test_ret += test_xmlNanoFTPDele();
    test_ret += test_xmlNanoFTPGet();
    test_ret += test_xmlNanoFTPGetConnection();
    test_ret += test_xmlNanoFTPGetResponse();
    test_ret += test_xmlNanoFTPGetSocket();
    test_ret += test_xmlNanoFTPInit();
    test_ret += test_xmlNanoFTPList();
    test_ret += test_xmlNanoFTPNewCtxt();
    test_ret += test_xmlNanoFTPOpen();
    test_ret += test_xmlNanoFTPProxy();
    test_ret += test_xmlNanoFTPQuit();
    test_ret += test_xmlNanoFTPRead();
    test_ret += test_xmlNanoFTPScanProxy();
    test_ret += test_xmlNanoFTPUpdateURL();

    if (test_ret != 0)
	printf("Module nanoftp: %d errors\n", test_ret);
    return(test_ret);
}